

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeSet::_toPattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  __off_t __length;
  uint local_30;
  int iStack_2c;
  uint16_t __c2;
  UChar32 c;
  int32_t backslashCount;
  int32_t i;
  UBool escapeUnprintable_local;
  UnicodeString *result_local;
  UnicodeSet *this_local;
  
  if (this->pat == (char16_t *)0x0) {
    this_local = (UnicodeSet *)_generatePattern(this,result,escapeUnprintable);
  }
  else {
    iStack_2c = 0;
    c = 0;
    while (this_local = (UnicodeSet *)result, c < this->patLen) {
      iVar3 = c + 1;
      local_30 = (uint)(ushort)this->pat[c];
      if ((((local_30 & 0xfffffc00) == 0xd800) && (iVar3 != this->patLen)) &&
         ((this->pat[iVar3] & 0xfc00U) == 0xdc00)) {
        local_30 = local_30 * 0x400 + (uint)(ushort)this->pat[iVar3] + 0xfca02400;
        iVar3 = c + 2;
      }
      c = iVar3;
      if ((escapeUnprintable == '\0') ||
         (UVar1 = ICU_Utility::isUnprintable(local_30), UVar1 == '\0')) {
        UnicodeString::append(result,local_30);
        if (local_30 == 0x5c) {
          iStack_2c = iStack_2c + 1;
        }
        else {
          iStack_2c = 0;
        }
      }
      else {
        if (iStack_2c % 2 == 1) {
          iVar2 = UnicodeString::length(result);
          UnicodeString::truncate(result,(char *)(ulong)(iVar2 - 1),__length);
        }
        ICU_Utility::escapeUnprintable(result,local_30);
        iStack_2c = 0;
      }
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString& UnicodeSet::_toPattern(UnicodeString& result,
                                      UBool escapeUnprintable) const
{
    if (pat != NULL) {
        int32_t i;
        int32_t backslashCount = 0;
        for (i=0; i<patLen; ) {
            UChar32 c;
            U16_NEXT(pat, i, patLen, c);
            if (escapeUnprintable && ICU_Utility::isUnprintable(c)) {
                // If the unprintable character is preceded by an odd
                // number of backslashes, then it has been escaped.
                // Before unescaping it, we delete the final
                // backslash.
                if ((backslashCount % 2) == 1) {
                    result.truncate(result.length() - 1);
                }
                ICU_Utility::escapeUnprintable(result, c);
                backslashCount = 0;
            } else {
                result.append(c);
                if (c == BACKSLASH) {
                    ++backslashCount;
                } else {
                    backslashCount = 0;
                }
            }
        }
        return result;
    }

    return _generatePattern(result, escapeUnprintable);
}